

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

TransactionContext * __thiscall
cfd::TransactionContext::operator=(TransactionContext *this,TransactionContext *context)

{
  TransactionContext *in_RSI;
  TransactionContext *in_RDI;
  map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
  *in_stack_ffffffffffffffa8;
  string *__return_storage_ptr__;
  string local_30;
  
  if (in_RDI != in_RSI) {
    __return_storage_ptr__ = &local_30;
    core::AbstractTransaction::GetHex_abi_cxx11_
              (__return_storage_ptr__,(AbstractTransaction *)in_RSI);
    core::Transaction::SetFromHex(&in_RDI->super_Transaction,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_30);
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator=
              ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this,
               (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)context);
    std::
    map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
    ::operator=((map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
                 *)__return_storage_ptr__,in_stack_ffffffffffffffa8);
    std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::operator=
              ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)this,
               (vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)context);
    std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::operator=
              ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)this,
               (vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)context);
  }
  return in_RDI;
}

Assistant:

TransactionContext& TransactionContext::operator=(
    const TransactionContext& context) & {
  if (this != &context) {
    SetFromHex(context.GetHex());
    utxo_map_ = context.utxo_map_;
    signed_map_ = context.signed_map_;
    verify_map_ = context.verify_map_;
    verify_ignore_map_ = context.verify_ignore_map_;
  }
  return *this;
}